

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O0

void cLUWorkFree(int *iwork,singlecomplex *dwork,GlobalLU_t *Glu)

{
  GlobalLU_t *Glu_local;
  singlecomplex *dwork_local;
  int *iwork_local;
  
  if (Glu->MemModel == SYSTEM) {
    superlu_free(iwork);
    superlu_free(dwork);
  }
  else {
    (Glu->stack).used = (Glu->stack).used - ((Glu->stack).size - (Glu->stack).top2);
    (Glu->stack).top2 = (Glu->stack).size;
  }
  superlu_free(Glu->expanders);
  Glu->expanders = (ExpHeader *)0x0;
  return;
}

Assistant:

void cLUWorkFree(int *iwork, singlecomplex *dwork, GlobalLU_t *Glu)
{
    if ( Glu->MemModel == SYSTEM ) {
	SUPERLU_FREE (iwork);
	SUPERLU_FREE (dwork);
    } else {
	Glu->stack.used -= (Glu->stack.size - Glu->stack.top2);
	Glu->stack.top2 = Glu->stack.size;
/*	cStackCompress(Glu);  */
    }
    
    SUPERLU_FREE (Glu->expanders);	
    Glu->expanders = NULL;
}